

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CameraInfo.h
# Opt level: O0

void __thiscall ViconCGStream::VCameraInfo::Write(VCameraInfo *this,VBuffer *i_rBuffer)

{
  VBuffer *i_rBuffer_local;
  VCameraInfo *this_local;
  
  ViconCGStreamIO::VBuffer::Write<unsigned_int>(i_rBuffer,&this->m_CameraID);
  ViconCGStreamIO::VBuffer::Write<unsigned_long_long>(i_rBuffer,&this->m_FramePeriod);
  ViconCGStreamIO::VBuffer::Write<std::__cxx11::string>(i_rBuffer,&this->m_Type);
  ViconCGStreamIO::VBuffer::Write<std::__cxx11::string>(i_rBuffer,&this->m_DisplayType);
  ViconCGStreamIO::VBuffer::Write<std::__cxx11::string>(i_rBuffer,&this->m_Name);
  ViconCGStreamIO::VBuffer::Write<unsigned_int>(i_rBuffer,&this->m_ResolutionX);
  ViconCGStreamIO::VBuffer::Write<unsigned_int>(i_rBuffer,&this->m_ResolutionY);
  ViconCGStreamIO::VBuffer::Write<double>(i_rBuffer,&this->m_AspectRatio);
  ViconCGStreamIO::VBuffer::Write<double>(i_rBuffer,&this->m_CircularityThreshold);
  ViconCGStreamIO::VBuffer::Write<bool>(i_rBuffer,&this->m_bCentroidTracking);
  ViconCGStreamIO::VBuffer::Write<bool>(i_rBuffer,&this->m_bIsVideoCamera);
  ViconCGStreamIO::VBuffer::Write<unsigned_int>(i_rBuffer,&this->m_UserID);
  ViconCGStreamIO::VBuffer::Write<double>(i_rBuffer,&this->m_MarkerVelocity);
  return;
}

Assistant:

virtual void Write( ViconCGStreamIO::VBuffer & i_rBuffer ) const
  {
    i_rBuffer.Write( m_CameraID );
    i_rBuffer.Write( m_FramePeriod );
    i_rBuffer.Write( m_Type );
    i_rBuffer.Write( m_DisplayType );
    i_rBuffer.Write( m_Name );
    i_rBuffer.Write( m_ResolutionX );
    i_rBuffer.Write( m_ResolutionY );
    i_rBuffer.Write( m_AspectRatio );
    i_rBuffer.Write( m_CircularityThreshold );
    i_rBuffer.Write( m_bCentroidTracking );
    i_rBuffer.Write( m_bIsVideoCamera );
    i_rBuffer.Write( m_UserID );
    i_rBuffer.Write( m_MarkerVelocity );
  }